

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_byte.h
# Opt level: O2

void RansEncPutSymbol(RansState *r,uint8_t **pptr,RansEncSymbol *sym)

{
  uint uVar1;
  uint uVar2;
  uint8_t *puVar3;
  
  uVar1 = sym->x_max;
  if (uVar1 != 0) {
    uVar2 = *r;
    if (uVar1 <= uVar2) {
      puVar3 = *pptr;
      do {
        puVar3[-1] = (uint8_t)uVar2;
        puVar3 = puVar3 + -1;
        uVar2 = uVar2 >> 8;
      } while (uVar1 <= uVar2);
      *pptr = puVar3;
    }
    *r = (uint)sym->cmpl_freq *
         (int)((ulong)sym->rcp_freq * (ulong)uVar2 >> ((byte)sym->rcp_shift & 0x3f)) +
         uVar2 + sym->bias;
    return;
  }
  __assert_fail("sym->x_max != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                ,0x10f,"void RansEncPutSymbol(RansState *, uint8_t **, const RansEncSymbol *)");
}

Assistant:

static inline void RansEncPutSymbol(RansState* r, uint8_t** pptr, RansEncSymbol const* sym)
{
    RansAssert(sym->x_max != 0); // can't encode symbol with freq=0

    // renormalize
    uint32_t x = *r;
    uint32_t x_max = sym->x_max;

    if (x >= x_max) {
	uint8_t* ptr = *pptr;
	do {
	    *--ptr = (uint8_t) (x & 0xff);
	    x >>= 8;
	} while (x >= x_max);
	*pptr = ptr;
    }

    // x = C(s,x)
    // NOTE: written this way so we get a 32-bit "multiply high" when
    // available. If you're on a 64-bit platform with cheap multiplies
    // (e.g. x64), just bake the +32 into rcp_shift.
    //uint32_t q = (uint32_t) (((uint64_t)x * sym->rcp_freq) >> 32) >> sym->rcp_shift;

    // The extra >>32 has already been added to RansEncSymbolInit
    uint32_t q = (uint32_t) (((uint64_t)x * sym->rcp_freq) >> sym->rcp_shift);
    *r = x + sym->bias + q * sym->cmpl_freq;
}